

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toinst.cpp
# Opt level: O0

unique_ptr<llvm::Instruction,_std::function<void_(llvm::Instruction_*)>_> * toInst(ConstantExpr *ce)

{
  anon_class_1_0_00000001 *__f;
  Instruction *in_RSI;
  function<void_(llvm::Instruction_*)> *in_RDI;
  pointer in_stack_ffffffffffffffa8;
  function<void_(llvm::Instruction_*)> *this;
  
  this = in_RDI;
  __f = (anon_class_1_0_00000001 *)llvm::ConstantExpr::getAsInstruction(in_RSI);
  std::function<void(llvm::Instruction*)>::function<toInst(llvm::ConstantExpr*)::__0,void>(this,__f)
  ;
  std::unique_ptr<llvm::Instruction,std::function<void(llvm::Instruction*)>>::
  unique_ptr<std::function<void(llvm::Instruction*)>,void>
            ((unique_ptr<llvm::Instruction,_std::function<void_(llvm::Instruction_*)>_> *)in_RDI,
             in_stack_ffffffffffffffa8,
             (__enable_if_t<_is_lvalue_reference<function<void_(Instruction_*)>_>::value,_std::function<void_(llvm::Instruction_*)>_&&>
              )0x29ad31);
  std::function<void_(llvm::Instruction_*)>::~function
            ((function<void_(llvm::Instruction_*)> *)0x29ad3b);
  return (unique_ptr<llvm::Instruction,_std::function<void_(llvm::Instruction_*)>_> *)this;
}

Assistant:

std::unique_ptr<llvm::Instruction, std::function<void(llvm::Instruction*)>> toInst(
    llvm::ConstantExpr* ce){
    return std::unique_ptr<llvm::Instruction, std::function<void(llvm::Instruction*)>>(
        ce->getAsInstruction(),
        [](llvm::Instruction* inst) { inst->deleteValue(); }
    );
}